

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptNumber.cpp
# Opt level: O3

JavascriptString * Js::JavascriptNumber::ToLocaleString(double value,ScriptContext *scriptContext)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  charcount_t cVar4;
  BOOL BVar5;
  Var aValue;
  JavascriptString *pJVar6;
  undefined4 extraout_var;
  size_t sVar7;
  HeapAllocator *this;
  undefined4 *puVar8;
  char16 *buffer;
  size_t byteSize;
  WCHAR local_a68 [4];
  WCHAR szRes [1280];
  TrackAllocData data;
  
  bVar2 = NumberUtilities::IsFinite(value);
  if (!bVar2) {
    pJVar6 = ToLocaleStringNanOrInfinite(value,scriptContext);
    return pJVar6;
  }
  aValue = FormatDoubleToString(value,FormatFixed,-1,scriptContext);
  pJVar6 = VarTo<Js::JavascriptString>(aValue);
  iVar3 = (*(pJVar6->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject[0x65])(pJVar6);
  cVar4 = JavascriptString::GetLength(pJVar6);
  sVar7 = PlatformAgnostic::Numbers::Utility::NumberToDefaultLocaleString
                    ((WCHAR *)CONCAT44(extraout_var,iVar3),(ulong)cVar4,local_a68,0x500);
  if (sVar7 != 0) {
    if (sVar7 < 0x501) {
      pJVar6 = JavascriptString::NewCopySz(local_a68,scriptContext);
      return pJVar6;
    }
    szRes._2552_8_ = &char16_t::typeinfo;
    this = Memory::HeapAllocator::TrackAllocInfo
                     (&Memory::HeapAllocator::Instance,(TrackAllocData *)(szRes + 0x4fc));
    byteSize = 0xffffffffffffffff;
    if (-1 < (long)sVar7) {
      byteSize = sVar7 * 2;
    }
    BVar5 = ExceptionCheck::CanHandleOutOfMemory();
    if (BVar5 == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                  ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                                  "ExceptionCheck::CanHandleOutOfMemory()");
      if (!bVar2) goto LAB_00cdc5aa;
      *puVar8 = 0;
    }
    buffer = (char16 *)Memory::HeapAllocator::AllocT<false>(this,byteSize);
    if (buffer == (char16 *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                  ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
      if (!bVar2) goto LAB_00cdc5aa;
      *puVar8 = 0;
    }
    sVar7 = PlatformAgnostic::Numbers::Utility::NumberToDefaultLocaleString
                      ((WCHAR *)CONCAT44(extraout_var,iVar3),(ulong)cVar4,buffer,sVar7);
    if (sVar7 == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptNumber.cpp"
                                  ,0x45e,"(false)","GetNumberFormatEx failed");
      if (bVar2) {
        *puVar8 = 0;
        JavascriptError::ThrowError(scriptContext,-0x7ff5ffcd,(PCWSTR)0x0);
      }
LAB_00cdc5aa:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    pJVar6 = JavascriptString::NewCopySz(buffer,scriptContext);
    if (buffer != (char16 *)0x0) {
      Memory::DeleteArray<Memory::HeapAllocator,char16_t>
                (&Memory::HeapAllocator::Instance,sVar7,buffer);
    }
  }
  return pJVar6;
}

Assistant:

JavascriptString* JavascriptNumber::ToLocaleString(double value, ScriptContext* scriptContext)
    {
        WCHAR   szRes[bufSize];
        WCHAR * pszRes = NULL;
        WCHAR * pszToBeFreed = NULL;
        size_t  count;

        if (!Js::NumberUtilities::IsFinite(value))
        {
            //
            // +- Infinity : use the localized string
            // NaN would be returned as NaN
            //
            return ToLocaleStringNanOrInfinite(value, scriptContext);
        }

        JavascriptString *result = nullptr;

        JavascriptString *dblStr = VarTo<JavascriptString>(FormatDoubleToString(value, NumberUtilities::FormatFixed, -1, scriptContext));
        const char16* szValue = dblStr->GetSz();
        const size_t szLength = dblStr->GetLength();

        pszRes = szRes;
        count = Numbers::Utility::NumberToDefaultLocaleString(szValue, szLength, pszRes, bufSize);

        if( count == 0 )
        {
            return dblStr;
        }
        else
        {
            if( count > bufSize )
            {
                pszRes = pszToBeFreed = HeapNewArray(char16, count);

                count = Numbers::Utility::NumberToDefaultLocaleString(szValue, szLength, pszRes, count);

                if ( count == 0 )
                {
                     AssertMsg(false, "GetNumberFormatEx failed");
                     JavascriptError::ThrowError(scriptContext, VBSERR_InternalError);
                }
            }

            if ( count != 0 )
            {
                result = JavascriptString::NewCopySz(pszRes, scriptContext);
            }
        }

        if ( pszToBeFreed )
        {
            HeapDeleteArray(count, pszToBeFreed);
        }

        return result;
    }